

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZEncoder.cpp
# Opt level: O0

void ZXing::Aztec::GenerateCheckWords
               (BitArray *bitArray,int totalBits,int wordSize,BitArray *messageBits)

{
  bool bVar1;
  GenericGF *this;
  int in_EDX;
  int in_ESI;
  int messageWord;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int startPad;
  vector<int,_std::allocator<int>_> messageWords;
  BitArray *in_stack_ffffffffffffff68;
  BitArray *in_stack_ffffffffffffff70;
  BitArray *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  undefined8 in_stack_ffffffffffffffa0;
  int numECCodeWords;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  GenericGF *in_stack_ffffffffffffffb0;
  BitArray *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffcc;
  
  numECCodeWords = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  ToInts<int,void>(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                   (int)in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  this = GetGFFromWordSize(in_stack_ffffffffffffffcc);
  BitArray::size(in_stack_ffffffffffffff70);
  ReedSolomonEncode(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,numECCodeWords);
  this_00 = (BitArray *)&stack0xffffffffffffffa8;
  BitArray::BitArray((BitArray *)0x26396a);
  BitArray::operator=(this_00,in_stack_ffffffffffffff68);
  BitArray::~BitArray((BitArray *)0x263986);
  BitArray::appendBits((BitArray *)this,in_EDX,in_ESI);
  local_68._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_68);
    BitArray::appendBits((BitArray *)this,in_EDX,in_ESI);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_68);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  return;
}

Assistant:

static void GenerateCheckWords(const BitArray& bitArray, int totalBits, int wordSize, BitArray& messageBits)
{
	// bitArray is guaranteed to be a multiple of the wordSize, so no padding needed
	std::vector<int> messageWords = ToInts(bitArray, wordSize, totalBits / wordSize);
	ReedSolomonEncode(GetGFFromWordSize(wordSize), messageWords, (totalBits - bitArray.size()) / wordSize);
	int startPad = totalBits % wordSize;
	messageBits = BitArray();
	messageBits.appendBits(0, startPad);
	for (int messageWord : messageWords)
		messageBits.appendBits(messageWord, wordSize);
}